

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_NAMESPACE::Save
          (_Type_NAMESPACE *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Namespace *this_00;
  uint uVar1;
  char *__s;
  size_t sVar2;
  Object *pOVar3;
  long *plVar4;
  long in_R8;
  Memory *pMVar5;
  Namespace local_60;
  Object *local_40;
  long local_38;
  
  this_00 = (Namespace *)object->data;
  local_60.memory = (Memory *)caller;
  local_40 = object;
  local_38 = in_R8;
  uVar1 = Namespace::Count(this_00);
  local_60.vars.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (undefined1)uVar1;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
  local_60.vars.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (undefined1)(uVar1 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
  local_60.vars.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (undefined1)(uVar1 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
  local_60.vars.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (undefined1)(uVar1 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
  local_60.vars.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Namespace::Count(this_00);
  if (local_60.vars.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    uVar1 = 0;
    do {
      __s = Namespace::GetKey(this_00,uVar1);
      if (__s == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
      }
      local_60.vars.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
      plVar4 = (long *)((long)(local_40->memory->arr)._M_elems + local_38);
      pMVar5 = local_60.memory;
      if (((ulong)local_60.memory & 1) != 0) {
        pMVar5 = *(Memory **)((long)((local_60.memory)->arr)._M_elems + *plVar4 + -1);
      }
      Namespace::GetVariable(&local_60,(uint)this_00);
      pOVar3 = Variable::operator->((Variable *)&local_60);
      (*(code *)pMVar5)(plVar4,stream,pOVar3->ID);
      Variable::~Variable((Variable *)&local_60);
      uVar1 = uVar1 + 1;
    } while (local_60.vars.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != uVar1);
  }
  return;
}

Assistant:

void LiteScript::_Type_NAMESPACE::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Namespace& obj = object.GetData<Namespace>();
    OStreamer::Write<unsigned int>(stream, obj.Count());
    for (unsigned int i = 0, sz = obj.Count(); i < sz; i++) {
        stream << obj.GetKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetVariable(i)->ID);
    }
}